

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateFragSizeAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  Instruction *inst_00;
  Instruction *decoration_00;
  bool bVar1;
  spv_result_t sVar2;
  spv_const_context psVar3;
  anon_class_24_3_41b08022 local_68;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  undefined4 local_30;
  BuiltIn local_2c;
  spv_result_t error;
  BuiltIn builtin;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _error = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar3 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  if (bVar1) {
    local_2c = Decoration::builtin((Decoration *)inst_local);
    decoration_00 = inst_local;
    inst_00 = _error;
    local_68.inst = _error;
    local_68.builtin = &local_2c;
    local_68.this = this;
    std::function<spv_result_t(std::__cxx11::string_const&)>::
    function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateFragSizeAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
              ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_50,&local_68);
    sVar2 = ValidateI32Vec(this,(Decoration *)decoration_00,inst_00,2,&local_50);
    std::
    function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_50);
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    local_30 = 0;
  }
  sVar2 = ValidateFragSizeAtReference(this,(Decoration *)inst_local,_error,_error,_error);
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateFragSizeAtDefinition(const Decoration& decoration,
                                            const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    if (spv_result_t error = ValidateI32Vec(
            decoration, inst, 2,
            [this, &inst, &builtin](const std::string& message) -> spv_result_t {
              uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorType);
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(vuid) << "According to the "
                     << spvLogStringForEnv(_.context()->target_env)
                     << " spec BuiltIn "
                     << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                      uint32_t(builtin))
                     << " variable needs to be a 2-component 32-bit int vector. "
                     << message;
            })) {
      return error;
    }
  }

  return ValidateFragSizeAtReference(decoration, inst, inst, inst);
}